

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void __thiscall backward::SourceFile::SourceFile(SourceFile *this,string *path)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  undefined8 uVar4;
  dummy *pdVar5;
  void *pvVar6;
  handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
  *in_RDI;
  string new_path;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *prefixes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  char in_stack_ffffffffffffff47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
  *in_stack_ffffffffffffff58;
  handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
  *in_stack_ffffffffffffff60;
  string local_70 [32];
  string local_50 [32];
  ulong local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  details::
  handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
  ::handle(in_RDI);
  local_18 = get_paths_from_env_variable_abi_cxx11_
                       ((SourceFile *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40))
  ;
  for (local_30 = 0; uVar1 = local_30,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_18), uVar1 < sVar3; local_30 = local_30 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,local_30);
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff47);
    std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::__cxx11::string::~string(local_70);
    in_stack_ffffffffffffff58 = in_RDI;
    in_stack_ffffffffffffff60 =
         (handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
          *)operator_new(0x208);
    uVar4 = std::__cxx11::string::c_str();
    std::ifstream::ifstream(in_stack_ffffffffffffff60,uVar4,8);
    details::
    handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
    ::reset(in_stack_ffffffffffffff60,
            (basic_ifstream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff58);
    bVar2 = is_open((SourceFile *)0x1a1a1c);
    std::__cxx11::string::~string(local_50);
    if (bVar2) break;
  }
  pdVar5 = details::handle::operator_cast_to_dummy_((handle *)in_RDI);
  if ((pdVar5 == (dummy *)0x0) || (bVar2 = is_open((SourceFile *)0x1a1b1c), !bVar2)) {
    pvVar6 = operator_new(0x208);
    uVar4 = std::__cxx11::string::c_str();
    std::ifstream::ifstream(pvVar6,uVar4,8);
    details::
    handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
    ::reset(in_stack_ffffffffffffff60,
            (basic_ifstream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff58);
  }
  return;
}

Assistant:

SourceFile(const std::string &path) {
    // 1. If BACKWARD_CXX_SOURCE_PREFIXES is set then assume it contains
    //    a colon-separated list of path prefixes.  Try prepending each
    //    to the given path until a valid file is found.
    const std::vector<std::string> &prefixes = get_paths_from_env_variable();
    for (size_t i = 0; i < prefixes.size(); ++i) {
      // Double slashes (//) should not be a problem.
      std::string new_path = prefixes[i] + '/' + path;
      _file.reset(new std::ifstream(new_path.c_str()));
      if (is_open())
        break;
    }
    // 2. If no valid file found then fallback to opening the path as-is.
    if (!_file || !is_open()) {
      _file.reset(new std::ifstream(path.c_str()));
    }
  }